

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tiles.cpp
# Opt level: O2

vector<sfc::Tile,_std::allocator<sfc::Tile>_> * __thiscall
sfc::Tileset::remap_tiles_for_input
          (vector<sfc::Tile,_std::allocator<sfc::Tile>_> *__return_storage_ptr__,Tileset *this,
          vector<sfc::Tile,_std::allocator<sfc::Tile>_> *tiles,Mode mode)

{
  uint uVar1;
  pointer pTVar2;
  runtime_error *this_00;
  uint yo;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  sbyte local_d0;
  vector<sfc::Tile,_std::allocator<sfc::Tile>_> metatile;
  Tile local_88;
  
  (__return_storage_ptr__->super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (mode == snes) {
    uVar1 = this->_tile_width;
    uVar5 = this->_tile_height;
    if (uVar5 != 0x10 && uVar1 != 0x10) {
LAB_00146b2d:
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"programmer error (remap_tiles_for_input invoked erroneously invoked)");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_d0 = 4;
  }
  else {
    if ((1 < mode - gb) || (this->_tile_height != 0x10)) goto LAB_00146b2d;
    uVar1 = this->_tile_width;
    uVar5 = 0x10;
    local_d0 = 0;
  }
  for (uVar4 = 0;
      uVar4 < (ulong)(((long)(this->_tiles).
                             super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(this->_tiles).super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x58);
      uVar4 = (ulong)((int)uVar4 + 1)) {
    metatile.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    metatile.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    metatile.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (uVar3 = 0; uVar3 != uVar5 >> 3; uVar3 = uVar3 + 1) {
      uVar6 = (uVar3 << local_d0) + (int)uVar4;
      uVar7 = (ulong)(uVar1 >> 3);
      while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
        pTVar2 = (tiles->super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)uVar6 <
            (ulong)(((long)(tiles->super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2) / 0x58)) {
          std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::push_back(&metatile,pTVar2 + uVar6);
        }
        uVar6 = uVar6 + 1;
      }
    }
    if (((long)metatile.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
               super__Vector_impl_data._M_finish -
        (long)metatile.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
              super__Vector_impl_data._M_start) / 0x58 == (ulong)((uVar5 >> 3) * (uVar1 >> 3))) {
      Tile::Tile(&local_88,&metatile,this->_no_flip,this->_tile_width,this->_tile_height);
      std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::emplace_back<sfc::Tile>
                (__return_storage_ptr__,&local_88);
      Tile::~Tile(&local_88);
    }
    std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::~vector(&metatile);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Tile> Tileset::remap_tiles_for_input(const std::vector<Tile>& tiles, Mode mode) const {
  std::vector<Tile> tv;

  if ((mode == Mode::snes && (_tile_width == 16 || _tile_height == 16))
      || ( (mode == Mode::gb || mode == Mode::gbc) && _tile_height == 16)) {
    const unsigned cells_per_tile_h = _tile_width / 8;
    const unsigned cells_per_tile_v = _tile_height / 8;

    for (unsigned i = 0; i < _tiles.size(); ++i) {
      std::vector<Tile> metatile;
      for (unsigned yo = 0; yo < cells_per_tile_v; ++yo) {
        for (unsigned xo = 0; xo < cells_per_tile_h; ++xo) {
          if ((i + (yo * (mode == Mode::snes ? 16:1)) + xo) < tiles.size())
            metatile.push_back(tiles[i + (yo * (mode == Mode::snes ? 16:1)) + xo]);
        }
      }
      if (metatile.size() == cells_per_tile_h * cells_per_tile_v)
        tv.push_back(Tile(metatile, _no_flip, _tile_width, _tile_height));
    }

  } else {
    throw std::runtime_error("programmer error (remap_tiles_for_input invoked erroneously invoked)");
  }

  return tv;
}